

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void bc_error_print(bc_error_t *err,char *prefix)

{
  if (err == (bc_error_t *)0x0) {
    return;
  }
  bc_error_print_cold_1();
  return;
}

Assistant:

void
bc_error_print(bc_error_t *err, const char *prefix)
{
    if (err == NULL)
        return;

    if (prefix != NULL)
        fprintf(stderr, "%s: ", prefix);

    switch(err->type) {
        case BC_ERROR_CONFIG_PARSER:
            fprintf(stderr, "error: config-parser: %s\n", err->msg);
            break;
        case BC_ERROR_FILE:
            fprintf(stderr, "error: file: %s\n", err->msg);
            break;
        case BLOGC_ERROR_SOURCE_PARSER:
            fprintf(stderr, "error: source: %s\n", err->msg);
            break;
        case BLOGC_ERROR_TEMPLATE_PARSER:
            fprintf(stderr, "error: template: %s\n", err->msg);
            break;
        case BLOGC_ERROR_LOADER:
            fprintf(stderr, "error: loader: %s\n", err->msg);
            break;
        case BLOGC_WARNING_DATETIME_PARSER:
            fprintf(stderr, "warning: datetime: %s\n", err->msg);
            break;
        case BLOGC_MAKE_ERROR_SETTINGS:
            fprintf(stderr, "error: settings: %s\n", err->msg);
            break;
        case BLOGC_MAKE_ERROR_EXEC:
            fprintf(stderr, "error: exec: %s\n", err->msg);
            break;
        case BLOGC_MAKE_ERROR_ATOM:
            fprintf(stderr, "error: atom: %s\n", err->msg);
            break;
        case BLOGC_MAKE_ERROR_UTILS:
            fprintf(stderr, "error: utils: %s\n", err->msg);
            break;
        default:
            fprintf(stderr, "error: %s\n", err->msg);
    }
}